

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  DescriptorPool *pDVar1;
  MessageFactory *pMVar2;
  uint uVar3;
  MessageLite *p_00;
  bool bVar4;
  int iVar5;
  uint32_t size_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  Data *pDVar7;
  undefined4 extraout_var;
  MessageLite *ptr_00;
  undefined8 s;
  StringPiece val;
  MessageLite *local_188;
  undefined1 local_148 [4];
  int32_t size;
  ParseContext tmp_ctx;
  char *p;
  MessageLite *value;
  char *local_b8;
  bool local_a9;
  undefined1 local_a8 [7];
  bool was_packed_on_wire;
  ExtensionInfo extension;
  uint64_t local_78;
  uint64_t tmp;
  uint32_t tag;
  byte local_5d;
  uint local_5c;
  undefined1 local_58 [3];
  bool payload_read;
  uint32_t type_id;
  string payload;
  ParseContext *ctx_local;
  InternalMetadata *metadata_local;
  MessageLite *extendee_local;
  char *ptr_local;
  ExtensionSet *this_local;
  
  payload.field_2._8_8_ = ctx;
  extendee_local = (MessageLite *)ptr;
  ptr_local = (char *)this;
  std::__cxx11::string::string((string *)local_58);
  local_5c = 0;
  local_5d = 0;
  do {
    while( true ) {
      while( true ) {
        bVar4 = ParseContext::Done((ParseContext *)payload.field_2._8_8_,(char **)&extendee_local);
        p_00 = extendee_local;
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          this_local = (ExtensionSet *)extendee_local;
          goto LAB_00764557;
        }
        ptr_00 = (MessageLite *)((long)&extendee_local->_vptr_MessageLite + 1);
        tmp._0_4_ = (uint)*(byte *)&extendee_local->_vptr_MessageLite;
        extendee_local = ptr_00;
        if ((uint)tmp != 0x10) break;
        extendee_local = (MessageLite *)ParseBigVarint((char *)ptr_00,&local_78);
        if (extendee_local == (MessageLite *)0x0) {
          this_local = (ExtensionSet *)0x0;
          goto LAB_00764557;
        }
        local_5c = (uint)local_78;
        if ((local_5d & 1) != 0) {
          ExtensionInfo::ExtensionInfo((ExtensionInfo *)local_a8);
          s = payload.field_2._8_8_;
          bVar4 = FindExtension(this,2,local_5c,extendee,(ParseContext *)payload.field_2._8_8_,
                                (ExtensionInfo *)local_a8,&local_a9);
          uVar3 = local_5c;
          if (bVar4) {
            if ((extension.message._5_1_ & 1) == 0) {
              local_188 = MutableMessage(this,local_5c,'\v',(MessageLite *)extension._8_8_,
                                         (FieldDescriptor *)
                                         extension.field_5.enum_validity_check.arg);
            }
            else {
              local_188 = AddMessage(this,local_5c,'\v',(MessageLite *)extension._8_8_,
                                     (FieldDescriptor *)extension.field_5.enum_validity_check.arg);
            }
            iVar5 = ParseContext::depth((ParseContext *)payload.field_2._8_8_);
            ParseContext::ParseContext<std::__cxx11::string&>
                      ((ParseContext *)local_148,iVar5,false,(char **)&tmp_ctx.data_.arena,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
            pDVar7 = ParseContext::data((ParseContext *)payload.field_2._8_8_);
            pDVar1 = pDVar7->pool;
            pDVar7 = ParseContext::data((ParseContext *)local_148);
            pDVar7->pool = pDVar1;
            pDVar7 = ParseContext::data((ParseContext *)payload.field_2._8_8_);
            pMVar2 = pDVar7->factory;
            pDVar7 = ParseContext::data((ParseContext *)local_148);
            pDVar7->factory = pMVar2;
            iVar5 = (*local_188->_vptr_MessageLite[10])(local_188,tmp_ctx.data_.arena,local_148);
            if ((CONCAT44(extraout_var,iVar5) == 0) ||
               (bVar4 = EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)local_148), !bVar4))
            {
              this_local = (ExtensionSet *)0x0;
              goto LAB_00764557;
            }
          }
          else {
            stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                      ((StringPiece *)&value,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
            pbVar6 = InternalMetadata::mutable_unknown_fields<std::__cxx11::string>(metadata);
            val.length_ = (size_type)pbVar6;
            val.ptr_ = local_b8;
            WriteLengthDelimited((internal *)(ulong)uVar3,(uint32_t)value,val,(string *)s);
          }
          local_5c = 0;
        }
      }
      if ((uint)tmp != 0x1a) break;
      if (local_5c == 0) {
        size_00 = ReadSize((char **)&extendee_local);
        if (extendee_local == (MessageLite *)0x0) {
          this_local = (ExtensionSet *)0x0;
          goto LAB_00764557;
        }
        extendee_local =
             (MessageLite *)
             EpsCopyInputStream::ReadString
                       ((EpsCopyInputStream *)payload.field_2._8_8_,(char *)extendee_local,size_00,
                        (string *)local_58);
        if (extendee_local == (MessageLite *)0x0) {
          this_local = (ExtensionSet *)0x0;
          goto LAB_00764557;
        }
        local_5d = 1;
      }
      else {
        extendee_local =
             (MessageLite *)
             ParseFieldMaybeLazily
                       (this,(ulong)local_5c * 8 + 2,(char *)ptr_00,extendee,metadata,
                        (ParseContext *)payload.field_2._8_8_);
        if (extendee_local == (MessageLite *)0x0) {
          this_local = (ExtensionSet *)0x0;
          goto LAB_00764557;
        }
        local_5c = 0;
      }
    }
    extendee_local = (MessageLite *)ReadTag((char *)p_00,(uint32_t *)&tmp,0);
    if (((uint)tmp == 0) || (((uint)tmp & 7) == 4)) {
      EpsCopyInputStream::SetLastTag((EpsCopyInputStream *)payload.field_2._8_8_,(uint)tmp);
      this_local = (ExtensionSet *)extendee_local;
      goto LAB_00764557;
    }
    extendee_local =
         (MessageLite *)
         ParseField(this,(ulong)(uint)tmp,(char *)extendee_local,extendee,metadata,
                    (ParseContext *)payload.field_2._8_8_);
  } while (extendee_local != (MessageLite *)0x0);
  this_local = (ExtensionSet *)0x0;
LAB_00764557:
  extension.descriptor._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_58);
  return (char *)this_local;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* extendee, internal::InternalMetadata* metadata,
    internal::ParseContext* ctx) {
  std::string payload;
  uint32_t type_id = 0;
  bool payload_read = false;
  while (!ctx->Done(&ptr)) {
    uint32_t tag = static_cast<uint8_t>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64_t tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (payload_read) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, extendee, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64_t>(type_id) * 8 + 2, ptr,
                                    extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32_t size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        payload_read = true;
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, extendee, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}